

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

bool __thiscall ON_NurbsSurface::IsPeriodic(ON_NurbsSurface *this,int dir)

{
  bool bVar1;
  double *local_58;
  double *local_50;
  int local_40;
  int local_3c;
  int i1;
  int i0;
  double *cv1;
  double *cv0;
  bool local_1d;
  int k;
  bool bIsPeriodic;
  int dir_local;
  ON_NurbsSurface *this_local;
  
  local_1d = false;
  if (((-1 < dir) && (dir < 2)) &&
     (local_1d = ON_IsKnotVectorPeriodic(this->m_order[dir],this->m_cv_count[dir],this->m_knot[dir])
     , local_1d)) {
    local_3c = this->m_order[dir] + -2;
    local_40 = this->m_cv_count[dir] + -1;
    for (cv0._4_4_ = 0; cv0._4_4_ < this->m_cv_count[1 - dir]; cv0._4_4_ = cv0._4_4_ + 1) {
      if (dir == 0) {
        local_50 = CV(this,local_3c,cv0._4_4_);
      }
      else {
        local_50 = CV(this,cv0._4_4_,local_3c);
      }
      cv1 = local_50;
      if (dir == 0) {
        local_58 = CV(this,local_40,cv0._4_4_);
      }
      else {
        local_58 = CV(this,cv0._4_4_,local_40);
      }
      _i1 = local_58;
      for (; -1 < local_3c; local_3c = local_3c + -1) {
        bVar1 = ON_PointsAreCoincident(this->m_dim,this->m_is_rat != 0,cv1,_i1);
        if (!bVar1) {
          return false;
        }
        cv1 = cv1 + -(long)this->m_cv_stride[dir];
        _i1 = _i1 + -(long)this->m_cv_stride[dir];
        local_40 = local_40 + -1;
      }
    }
  }
  return local_1d;
}

Assistant:

bool 
ON_NurbsSurface::IsPeriodic( int dir ) const
{
  bool bIsPeriodic = false;
  if ( dir >= 0 && dir <= 1 )
  {
    int k;
    bIsPeriodic = ON_IsKnotVectorPeriodic( m_order[dir], m_cv_count[dir], m_knot[dir] );
    if ( bIsPeriodic ) 
    {
      const double *cv0, *cv1;
      int i0 = m_order[dir]-2;
      int i1 = m_cv_count[dir]-1;
      for ( k = 0; k < m_cv_count[1-dir]; k++ )
      {
        cv0 = (dir)?CV(k,i0):CV(i0,k);
        cv1 = (dir)?CV(k,i1):CV(i1,k);
        for ( /*empty*/; i0 >= 0; i0--, i1-- ) 
        {
          if ( false == ON_PointsAreCoincident( m_dim, m_is_rat, cv0, cv1 ) )
            return false;
          cv0 -= m_cv_stride[dir];
          cv1 -= m_cv_stride[dir];      
        }
      }
    }
  }
  return bIsPeriodic;
}